

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O1

void __thiscall InfoListWnd::InfoListWnd(InfoListWnd *this,WndMode _mode)

{
  pointer pcVar1;
  char *pcVar2;
  WndRect _initPos;
  char buf [100];
  string local_98 [3];
  
  _initPos.br = dataRefs.ILWrect.br;
  _initPos.tl = dataRefs.ILWrect.tl;
  LTImgWindow::LTImgWindow(&this->super_LTImgWindow,_mode,WND_STYLE_HUD,_initPos);
  (this->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow =
       (_func_int **)&PTR__InfoListWnd_002dded0;
  this->activeTab = ILW_TAB_NONE;
  (this->wndTitle)._M_dataplus._M_p = (pointer)&(this->wndTitle).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->wndTitle,"LiveTraffic","");
  ACTable::ACTable(&this->acList,false);
  this->sAcFilter[0x20] = '\0';
  this->sAcFilter[0x21] = '\0';
  this->sAcFilter[0x22] = '\0';
  this->sAcFilter[0x23] = '\0';
  this->sAcFilter[0x24] = '\0';
  this->sAcFilter[0x25] = '\0';
  this->sAcFilter[0x26] = '\0';
  this->sAcFilter[0x27] = '\0';
  this->sAcFilter[0x28] = '\0';
  this->sAcFilter[0x29] = '\0';
  this->sAcFilter[0x2a] = '\0';
  this->sAcFilter[0x2b] = '\0';
  this->sAcFilter[0x2c] = '\0';
  this->sAcFilter[0x2d] = '\0';
  this->sAcFilter[0x2e] = '\0';
  this->sAcFilter[0x2f] = '\0';
  this->sAcFilter[0x10] = '\0';
  this->sAcFilter[0x11] = '\0';
  this->sAcFilter[0x12] = '\0';
  this->sAcFilter[0x13] = '\0';
  this->sAcFilter[0x14] = '\0';
  this->sAcFilter[0x15] = '\0';
  this->sAcFilter[0x16] = '\0';
  this->sAcFilter[0x17] = '\0';
  this->sAcFilter[0x18] = '\0';
  this->sAcFilter[0x19] = '\0';
  this->sAcFilter[0x1a] = '\0';
  this->sAcFilter[0x1b] = '\0';
  this->sAcFilter[0x1c] = '\0';
  this->sAcFilter[0x1d] = '\0';
  this->sAcFilter[0x1e] = '\0';
  this->sAcFilter[0x1f] = '\0';
  this->sAcFilter[0] = '\0';
  this->sAcFilter[1] = '\0';
  this->sAcFilter[2] = '\0';
  this->sAcFilter[3] = '\0';
  this->sAcFilter[4] = '\0';
  this->sAcFilter[5] = '\0';
  this->sAcFilter[6] = '\0';
  this->sAcFilter[7] = '\0';
  this->sAcFilter[8] = '\0';
  this->sAcFilter[9] = '\0';
  this->sAcFilter[10] = '\0';
  this->sAcFilter[0xb] = '\0';
  this->sAcFilter[0xc] = '\0';
  this->sAcFilter[0xd] = '\0';
  this->sAcFilter[0xe] = '\0';
  this->sAcFilter[0xf] = '\0';
  this->sAcFilter[0x30] = '\0';
  this->sAcFilter[0x31] = '\0';
  this->msgLvlFilter = 0x3f;
  this->sMsgFilter[0] = '\0';
  this->sMsgFilter[1] = '\0';
  this->sMsgFilter[2] = '\0';
  this->sMsgFilter[3] = '\0';
  this->sMsgFilter[4] = '\0';
  this->sMsgFilter[5] = '\0';
  this->sMsgFilter[6] = '\0';
  this->sMsgFilter[7] = '\0';
  this->sMsgFilter[8] = '\0';
  this->sMsgFilter[9] = '\0';
  this->sMsgFilter[10] = '\0';
  this->sMsgFilter[0xb] = '\0';
  this->sMsgFilter[0xc] = '\0';
  this->sMsgFilter[0xd] = '\0';
  this->sMsgFilter[0xe] = '\0';
  this->sMsgFilter[0xf] = '\0';
  this->sMsgFilter[0x10] = '\0';
  this->sMsgFilter[0x11] = '\0';
  this->sMsgFilter[0x12] = '\0';
  this->sMsgFilter[0x13] = '\0';
  this->sMsgFilter[0x14] = '\0';
  this->sMsgFilter[0x15] = '\0';
  this->sMsgFilter[0x16] = '\0';
  this->sMsgFilter[0x17] = '\0';
  this->sMsgFilter[0x18] = '\0';
  this->sMsgFilter[0x19] = '\0';
  this->sMsgFilter[0x1a] = '\0';
  this->sMsgFilter[0x1b] = '\0';
  this->sMsgFilter[0x1c] = '\0';
  this->sMsgFilter[0x1d] = '\0';
  this->sMsgFilter[0x1e] = '\0';
  this->sMsgFilter[0x1f] = '\0';
  this->sMsgFilter[0x20] = '\0';
  this->sMsgFilter[0x21] = '\0';
  this->sMsgFilter[0x22] = '\0';
  this->sMsgFilter[0x23] = '\0';
  this->sMsgFilter[0x24] = '\0';
  this->sMsgFilter[0x25] = '\0';
  this->sMsgFilter[0x26] = '\0';
  this->sMsgFilter[0x27] = '\0';
  this->sMsgFilter[0x28] = '\0';
  this->sMsgFilter[0x29] = '\0';
  this->sMsgFilter[0x2a] = '\0';
  this->sMsgFilter[0x2b] = '\0';
  this->sMsgFilter[0x2c] = '\0';
  this->sMsgFilter[0x2d] = '\0';
  this->sMsgFilter[0x2e] = '\0';
  this->sMsgFilter[0x2f] = '\0';
  this->sMsgFilter[0x30] = '\0';
  this->sMsgFilter[0x31] = '\0';
  (this->msgIterList).
  super__List_base<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->msgIterList;
  (this->msgIterList).
  super__List_base<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->msgIterList;
  (this->msgIterList).
  super__List_base<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>
  ._M_impl._M_node._M_size = 0;
  this->msgCounterLastDisp = 0;
  *(undefined8 *)((long)&this->msgCounterLastDisp + 4) = 0;
  *(undefined8 *)((long)&this->msgCounterEnd + 4) = 0;
  (this->verText)._M_dataplus._M_p = (pointer)&(this->verText).field_2;
  (this->verText)._M_string_length = 0;
  (this->verText).field_2._M_local_buf[0] = '\0';
  (this->aiCtrlPlugin)._M_dataplus._M_p = (pointer)&(this->aiCtrlPlugin).field_2;
  (this->aiCtrlPlugin)._M_string_length = 0;
  (this->aiCtrlPlugin).field_2._M_local_buf[0] = '\0';
  this->weatherHPA = 1013.25;
  (this->weatherStationId)._M_dataplus._M_p = (pointer)&(this->weatherStationId).field_2;
  (this->weatherStationId)._M_string_length = 0;
  (this->weatherStationId).field_2._M_local_buf[0] = '\0';
  (this->weatherMETAR)._M_dataplus._M_p = (pointer)&(this->weatherMETAR).field_2;
  (this->weatherMETAR)._M_string_length = 0;
  (this->weatherMETAR).field_2._M_local_buf[0] = '\0';
  this->numCSLModels = -1;
  pcVar1 = (this->wndTitle)._M_dataplus._M_p;
  local_98[0]._M_dataplus._M_p = (pointer)&local_98[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar1,pcVar1 + (this->wndTitle)._M_string_length);
  ImgWindow::SetWindowTitle((ImgWindow *)this,local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  ImgWindow::SetWindowResizingLimits((ImgWindow *)this,200,200,9999,9999);
  (this->super_LTImgWindow).szHelpURL = "using-lt/info-list-window";
  snprintf((char *)local_98,100,"LiveTraffic %s",LT_VERSION_FULL);
  pcVar2 = (char *)(this->verText)._M_string_length;
  strlen((char *)local_98);
  std::__cxx11::string::_M_replace((ulong)&this->verText,0,pcVar2,(ulong)local_98);
  (this->acList).bFilterAcOnly = gIlwState.bFilterAcOnly;
  strncpy(this->sAcFilter,gIlwState.sAcFilter,0x32);
  this->msgLvlFilter = gIlwState.msgLvlFilter;
  strncpy(this->sMsgFilter,gIlwState.sMsgFilter,0x32);
  return;
}

Assistant:

InfoListWnd::InfoListWnd(WndMode _mode) :
LTImgWindow(_mode, WND_STYLE_HUD, dataRefs.ILWrect),
wndTitle(LIVE_TRAFFIC)
{
    // Set up window basics
    SetWindowTitle(GetWndTitle());
    SetWindowResizingLimits(ILW_RESIZE_LIMITS.tl.x, ILW_RESIZE_LIMITS.tl.y,
                            ILW_RESIZE_LIMITS.br.x, ILW_RESIZE_LIMITS.br.y);
    
    // Define Help URL to open for Help (?) button
    szHelpURL = HELP_ILW;
    
    // Compute version info text
    char buf[100];
    if constexpr (LIVETRAFFIC_VERSION_BETA)
        snprintf(buf, sizeof(buf), LIVE_TRAFFIC " %s, BETA version limited to %s",
                LT_VERSION_FULL, LT_BETA_VER_LIMIT_TXT);
    else
        snprintf(buf, sizeof(buf), LIVE_TRAFFIC " %s", LT_VERSION_FULL);
    verText = buf;
    
    // Restore state
    acList.bFilterAcOnly = gIlwState.bFilterAcOnly;
    strncpy(sAcFilter, gIlwState.sAcFilter, sizeof(sAcFilter));
    msgLvlFilter = gIlwState.msgLvlFilter;
    strncpy(sMsgFilter, gIlwState.sMsgFilter, sizeof(sMsgFilter));
}